

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O2

void anon_unknown.dwarf_276681::compareImages(char *fileName1,char *fileName2)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Box<Imath_3_2::Vec2<int>_> *this;
  Box<Imath_3_2::Vec2<int>_> *src;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  char *__assertion;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  Array<Imf_3_4::Rgba> pixels2;
  Array<Imf_3_4::Rgba> pixels1;
  RgbaInputFile in1;
  RgbaInputFile in2;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"comparing files ");
  poVar4 = std::operator<<(poVar4,fileName1);
  poVar4 = std::operator<<(poVar4," and ");
  poVar4 = std::operator<<(poVar4,fileName2);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(&in1,fileName1,iVar3);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(&in2,fileName2,iVar3);
  this = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
  src = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::RgbaInputFile::dataWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(this,src);
  if (bVar2) {
    piVar5 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
    iVar3 = *piVar5;
    iVar7 = (piVar5[2] - iVar3) + 1;
    iVar1 = piVar5[1];
    uVar9 = ((piVar5[3] - iVar1) + 1) * iVar7;
    Imf_3_4::Array<Imf_3_4::Rgba>::Array(&pixels1,(long)(int)uVar9);
    Imf_3_4::Array<Imf_3_4::Rgba>::Array(&pixels2,(long)(int)uVar9);
    lVar8 = (long)(iVar1 * iVar7);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&in1,(ulong)(pixels1._data + (-(long)iVar3 - lVar8)),1);
    Imf_3_4::RgbaInputFile::setFrameBuffer
              ((Rgba *)&in2,(ulong)(pixels2._data + (-(long)iVar3 - lVar8)),1);
    lVar8 = Imf_3_4::RgbaInputFile::dataWindow();
    iVar3 = *(int *)(lVar8 + 4);
    Imf_3_4::RgbaInputFile::dataWindow();
    Imf_3_4::RgbaInputFile::readPixels((int)&in1,iVar3);
    lVar8 = Imf_3_4::RgbaInputFile::dataWindow();
    iVar3 = *(int *)(lVar8 + 4);
    Imf_3_4::RgbaInputFile::dataWindow();
    Imf_3_4::RgbaInputFile::readPixels((int)&in2,iVar3);
    uVar6 = 0;
    uVar10 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar10 = uVar6;
    }
    do {
      if (uVar10 == uVar6) {
        Imf_3_4::Array<Imf_3_4::Rgba>::~Array(&pixels2);
        Imf_3_4::Array<Imf_3_4::Rgba>::~Array(&pixels1);
        Imf_3_4::RgbaInputFile::~RgbaInputFile(&in2);
        Imf_3_4::RgbaInputFile::~RgbaInputFile(&in1);
        return;
      }
      fVar11 = (*(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar6].r._h * 4) + 0.01
               ) / (*(float *)(_imath_half_to_float_table + (ulong)pixels2._data[uVar6].r._h * 4) +
                   0.01);
      if ((fVar11 < 0.9) || (1.1 < fVar11)) {
        __assertion = "approximatelyEqual (pixels1[i].r, pixels2[i].r)";
        uVar9 = 0x61;
        goto LAB_0017f505;
      }
      fVar11 = (*(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar6].g._h * 4) + 0.01
               ) / (*(float *)(_imath_half_to_float_table + (ulong)pixels2._data[uVar6].g._h * 4) +
                   0.01);
      if ((fVar11 < 0.9) || (1.1 < fVar11)) {
        __assertion = "approximatelyEqual (pixels1[i].g, pixels2[i].g)";
        uVar9 = 0x62;
        goto LAB_0017f505;
      }
      fVar11 = (*(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar6].b._h * 4) + 0.01
               ) / (*(float *)(_imath_half_to_float_table + (ulong)pixels2._data[uVar6].b._h * 4) +
                   0.01);
      if ((fVar11 < 0.9) || (1.1 < fVar11)) {
        __assertion = "approximatelyEqual (pixels1[i].b, pixels2[i].b)";
        uVar9 = 99;
        goto LAB_0017f505;
      }
      fVar11 = (*(float *)(_imath_half_to_float_table + (ulong)pixels1._data[uVar6].a._h * 4) + 0.01
               ) / (*(float *)(_imath_half_to_float_table + (ulong)pixels2._data[uVar6].a._h * 4) +
                   0.01);
    } while ((0.9 <= fVar11) && (uVar6 = uVar6 + 1, fVar11 <= 1.1));
    __assertion = "approximatelyEqual (pixels1[i].a, pixels2[i].a)";
    uVar9 = 100;
  }
  else {
    __assertion = "in1.dataWindow () == in2.dataWindow ()";
    uVar9 = 0x4d;
  }
LAB_0017f505:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                ,uVar9,"void (anonymous namespace)::compareImages(const char *, const char *)");
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName2);

    assert (in1.dataWindow () == in2.dataWindow ());

    const Box2i& dw = in1.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow ().min.y, in1.dataWindow ().max.y);
    in2.readPixels (in2.dataWindow ().min.y, in2.dataWindow ().max.y);

    for (int i = 0; i < w * h; ++i)
    {
        assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
        assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
        assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
        assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}